

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O1

void serialization::
     unserialize_helper<serialization::xml_iarchive,std::vector<int,std::allocator<int>>>
               (xml_iarchive *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v)

{
  size_type sVar1;
  size_type i;
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> local_48;
  
  sVar1 = xml_iarchive::load_sequence_start(ar);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::reserve(v,(ulong)sVar1);
  if (sVar1 != 0) {
    i = 0;
    do {
      xml_iarchive::load_sequence_item_start(ar,i);
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      unserialize_helper<serialization::xml_iarchive,int>(ar,&local_48);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)v,&local_48);
      xml_iarchive::load_sequence_item_end(ar);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      i = i + 1;
    } while (sVar1 != i);
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}